

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConstructSymbolTableVisitor.cpp
# Opt level: O2

void __thiscall
CConstructSymbolTableVisitor::Visit(CConstructSymbolTableVisitor *this,CCallMethodExp *exp)

{
  IExpression *pIVar1;
  CIdExp *pCVar2;
  CExpList *pCVar3;
  
  pIVar1 = (exp->objectExpression)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  if (pIVar1 != (IExpression *)0x0) {
    (*(code *)*(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
  }
  pCVar2 = (exp->methodName)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
           super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  if (pCVar2 != (CIdExp *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar2->super_IExpression).super_PositionedNode)(pCVar2,this);
  }
  pCVar3 = (exp->args)._M_t.super___uniq_ptr_impl<CExpList,_std::default_delete<CExpList>_>._M_t.
           super__Tuple_impl<0UL,_CExpList_*,_std::default_delete<CExpList>_>.
           super__Head_base<0UL,_CExpList_*,_false>._M_head_impl;
  if (pCVar3 != (CExpList *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar3->super_IExpression).super_PositionedNode)(pCVar3,this);
    return;
  }
  return;
}

Assistant:

void CConstructSymbolTableVisitor::Visit( CCallMethodExp &exp )
{
	if( exp.objectExpression ) {
		exp.objectExpression->Accept( *this );
	}
	if( exp.methodName ) {
		exp.methodName->Accept( *this );
	}
	if( exp.args ) {
		exp.args->Accept( *this );
	}
}